

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryVaryingGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
vkt::geometry::anon_unknown_1::VaryingTest::initPrograms
          (VaryingTest *this,SourceCollections *sourceCollections)

{
  VertexOutputs VVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  string local_5e0;
  ShaderSource local_5c0;
  allocator<char> local_591;
  string local_590;
  ostringstream local_570 [8];
  ostringstream src_2;
  string local_3f8;
  ShaderSource local_3d8;
  allocator<char> local_3a9;
  string local_3a8;
  ostringstream local_388 [8];
  ostringstream src_1;
  string local_210;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  SourceCollections *sourceCollections_local;
  VaryingTest *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<(poVar2,"layout(location = 1) in highp vec4 a_color;\n");
  VVar1 = (this->m_varyingTestSpec).vertexOutputs;
  if (VVar1 == VERTEXT_NO_OP) {
    poVar2 = std::operator<<((ostream *)local_190,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    std::operator<<(poVar2,"}\n");
  }
  else if (VVar1 == VERTEXT_ZERO) {
    poVar2 = std::operator<<((ostream *)local_190,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = a_position;\n");
    std::operator<<(poVar2,"}\n");
  }
  else if (VVar1 == VERTEXT_ONE) {
    poVar2 = std::operator<<((ostream *)local_190,"layout(location = 0) out highp vec4 v_geom_0;\n")
    ;
    poVar2 = std::operator<<(poVar2,"void main (void)\n");
    poVar2 = std::operator<<(poVar2,"{\n");
    poVar2 = std::operator<<(poVar2,"\tgl_Position = a_position;\n");
    poVar2 = std::operator<<(poVar2,"\tv_geom_0 = a_color;\n");
    std::operator<<(poVar2,"}\n");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vertex",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,&local_210);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::__cxx11::ostringstream::ostringstream(local_388);
  poVar2 = std::operator<<((ostream *)local_388,"#version 310 es\n");
  poVar2 = std::operator<<(poVar2,"#extension GL_EXT_geometry_shader : require\n");
  poVar2 = std::operator<<(poVar2,"layout(triangles) in;\n");
  std::operator<<(poVar2,"layout(triangle_strip, max_vertices = 3) out;\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::operator<<((ostream *)local_388,"layout(location = 0) in highp vec4 v_geom_0[];\n");
  }
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::operator<<((ostream *)local_388,"layout(location = 0) out highp vec4 v_frag_0;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::operator<<((ostream *)local_388,"layout(location = 1) out highp vec4 v_frag_1;\n");
  }
  poVar2 = std::operator<<((ostream *)local_388,"void main (void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n");
  poVar2 = std::operator<<(poVar2,"\thighp vec4 inputColor;\n");
  std::operator<<(poVar2,"\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::operator<<((ostream *)local_388,"\tinputColor = v_geom_0[0];\n");
  }
  else {
    std::operator<<((ostream *)local_388,"\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n");
  }
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_388,"\tgl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n");
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::operator<<((ostream *)local_388,"\tgl_Position = gl_in[0].gl_Position + offset;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    poVar2 = std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar2,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar2 = std::operator<<((ostream *)local_388,"\tEmitVertex();\n");
  std::operator<<(poVar2,"\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::operator<<((ostream *)local_388,"\tinputColor = v_geom_0[1];\n");
  }
  else {
    std::operator<<((ostream *)local_388,"\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n");
  }
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_388,"\tgl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n");
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::operator<<((ostream *)local_388,"\tgl_Position = gl_in[1].gl_Position + offset;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    poVar2 = std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar2,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar2 = std::operator<<((ostream *)local_388,"\tEmitVertex();\n");
  std::operator<<(poVar2,"\n");
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_ONE) {
    std::operator<<((ostream *)local_388,"\tinputColor = v_geom_0[2];\n");
  }
  else {
    std::operator<<((ostream *)local_388,"\tinputColor = vec4(1.0, 0.0, 0.0, 1.0);\n");
  }
  if ((this->m_varyingTestSpec).vertexOutputs == VERTEXT_NO_OP) {
    std::operator<<((ostream *)local_388,"\tgl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n");
  }
  if (VERTEXT_NO_OP < (this->m_varyingTestSpec).vertexOutputs) {
    std::operator<<((ostream *)local_388,"\tgl_Position = gl_in[2].gl_Position + offset;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    poVar2 = std::operator<<((ostream *)local_388,"\tv_frag_0 = inputColor * 0.5;\n");
    std::operator<<(poVar2,"\tv_frag_1 = inputColor.yxzw * 0.5;\n");
  }
  poVar2 = std::operator<<((ostream *)local_388,"\tEmitVertex();\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tEndPrimitive();\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,"geometry",&local_3a9);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_3a8);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_3d8,&local_3f8);
  glu::ProgramSources::operator<<(pPVar3,&local_3d8);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::__cxx11::ostringstream::~ostringstream(local_388);
  std::__cxx11::ostringstream::ostringstream(local_570);
  poVar2 = std::operator<<((ostream *)local_570,"#version 310 es\n");
  std::operator<<(poVar2,"layout(location = 0) out highp vec4 fragColor;\n");
  if (0 < (int)(this->m_varyingTestSpec).geometryOutputs) {
    std::operator<<((ostream *)local_570,"layout(location = 0) in highp vec4 v_frag_0;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::operator<<((ostream *)local_570,"layout(location = 1) in highp vec4 v_frag_1;\n");
  }
  poVar2 = std::operator<<((ostream *)local_570,"void main (void)\n");
  std::operator<<(poVar2,"{\n");
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ZERO) {
    std::operator<<((ostream *)local_570,"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_ONE) {
    std::operator<<((ostream *)local_570,"\tfragColor = v_frag_0;\n");
  }
  if ((this->m_varyingTestSpec).geometryOutputs == GEOMETRY_TWO) {
    std::operator<<((ostream *)local_570,"\tfragColor = v_frag_0 + v_frag_1.yxzw;\n");
  }
  std::operator<<((ostream *)local_570,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"fragment",&local_591);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_590);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_5c0,&local_5e0);
  glu::ProgramSources::operator<<(pPVar3,&local_5c0);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::ostringstream::~ostringstream(local_570);
  return;
}

Assistant:

void VaryingTest::initPrograms (SourceCollections& sourceCollections) const
{
	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) in highp vec4 a_position;\n"
			<<"layout(location = 1) in highp vec4 a_color;\n";
		switch(m_varyingTestSpec.vertexOutputs)
		{
			case VERTEXT_NO_OP:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "}\n";
				break;
			case VERTEXT_ZERO:
				src	<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "}\n";
				break;
			case VERTEXT_ONE:
				src	<<"layout(location = 0) out highp vec4 v_geom_0;\n"
					<< "void main (void)\n"
					<< "{\n"
					<< "	gl_Position = a_position;\n"
					<< "	v_geom_0 = a_color;\n"
					<< "}\n";
				break;
			default:
				DE_ASSERT(0);
		}
		sourceCollections.glslSources.add("vertex") << glu::VertexSource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "layout(location = 0) in highp vec4 v_geom_0[];\n";

		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<< "layout(location = 0) out highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "layout(location = 1) out highp vec4 v_frag_1;\n";

		src	<< "void main (void)\n"
			<< "{\n"
			<< "	highp vec4 offset = vec4(-0.2, -0.2, 0.0, 0.0);\n"
			<< "	highp vec4 inputColor;\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[0];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
			src	<< "	gl_Position = vec4(0.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
			src	<< "	gl_Position = gl_in[0].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";
		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[1];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 0.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[1].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_ONE)
			src	<< "	inputColor = v_geom_0[2];\n";
		else
			src	<< "	inputColor = vec4(1.0, 0.0, 0.0, 1.0);\n";

		if (m_varyingTestSpec.vertexOutputs == VERTEXT_NO_OP)
				src	<< "	gl_Position = vec4(1.0, 1.0, 0.0, 1.0) + offset;\n";
		if (m_varyingTestSpec.vertexOutputs >= VERTEXT_ZERO)
				src	<< "	gl_Position = gl_in[2].gl_Position + offset;\n";

		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<< "	v_frag_0 = inputColor;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<< "	v_frag_0 = inputColor * 0.5;\n"
				<< "	v_frag_1 = inputColor.yxzw * 0.5;\n";

		src	<< "	EmitVertex();\n"
			<< "\n"
			<< "	EndPrimitive();\n"
			<< "}\n";
		sourceCollections.glslSources.add("geometry") << glu::GeometrySource(src.str());
	}

	{
		std::ostringstream src;
		src	<< "#version 310 es\n"
			<<"layout(location = 0) out highp vec4 fragColor;\n";
		if (m_varyingTestSpec.geometryOutputs >= GEOMETRY_ONE)
			src	<<"layout(location = 0) in highp vec4 v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"layout(location = 1) in highp vec4 v_frag_1;\n";

		src	<<"void main (void)\n"
			<<"{\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ZERO)
			src	<<"fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_ONE)
			src	<<"	fragColor = v_frag_0;\n";
		if (m_varyingTestSpec.geometryOutputs == GEOMETRY_TWO)
			src	<<"	fragColor = v_frag_0 + v_frag_1.yxzw;\n";
		src	<<"}\n";
		sourceCollections.glslSources.add("fragment") << glu::FragmentSource(src.str());
	}
}